

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O2

_Bool sysbvm_identitySet_findWithExplicitHash
                (sysbvm_context_t *context,sysbvm_tuple_t set,void *element,
                sysbvm_identitySet_explicitHashFunction_t hashFunction,
                sysbvm_identitySet_explicitEqualsFunction_t equalsFunction,
                sysbvm_tuple_t *outFoundElement)

{
  ulong uVar1;
  _Bool _Var2;
  size_t sVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  size_t i_1;
  ulong uVar6;
  sysbvm_tuple_t sVar7;
  
  *outFoundElement = 0;
  if ((((set & 0xf) != 0 || set == 0) ||
      (uVar1 = *(ulong *)(set + 0x18), (uVar1 & 0xf) != 0 || uVar1 == 0)) ||
     (*(uint *)(uVar1 + 0xc) < 8)) {
    return false;
  }
  uVar6 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  sVar3 = (*hashFunction)(context,element);
  uVar4 = sVar3 % uVar6;
  uVar5 = uVar4;
  while (uVar5 < uVar6) {
    sVar7 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
    if (sVar7 == 0x3f) {
      return false;
    }
    _Var2 = (*equalsFunction)(element,sVar7);
    uVar5 = uVar5 + 1;
    if (_Var2) goto LAB_0013afc1;
  }
  uVar5 = 0;
  do {
    if (uVar4 <= uVar5) {
      return false;
    }
    sVar7 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
    if (sVar7 == 0x3f) {
      return false;
    }
    _Var2 = (*equalsFunction)(element,sVar7);
    uVar5 = uVar5 + 1;
  } while (!_Var2);
LAB_0013afc1:
  *outFoundElement = sVar7;
  return true;
}

Assistant:

SYSBVM_API bool sysbvm_identitySet_findWithExplicitHash(sysbvm_context_t *context, sysbvm_tuple_t set, void *element, sysbvm_identitySet_explicitHashFunction_t hashFunction, sysbvm_identitySet_explicitEqualsFunction_t equalsFunction, sysbvm_tuple_t *outFoundElement)
{
    *outFoundElement = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(set))
        return false;

    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    size_t capacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
    if(capacity == 0)
        return false;

    sysbvm_array_t *storage = (sysbvm_array_t*)setObject->storage;
    size_t hashIndex = hashFunction(context, element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        sysbvm_tuple_t setElement = storage->elements[i];
        if(setElement == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            return false;
        
        if(equalsFunction(element, setElement))
        {
            *outFoundElement = setElement;
            return true;
        }
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        sysbvm_tuple_t setElement = storage->elements[i];
        if(setElement == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            return false;
        
        if(equalsFunction(element, setElement))
        {
            *outFoundElement = setElement;
            return true;
        }
    }

    return false;
}